

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

vmd_status_t dtime_clb(vmd_time_t dtime,void *arg)

{
  int iVar1;
  long lVar2;
  export_ctx_t *ctx;
  int *piVar3;
  
  iVar1 = *(int *)(*arg + 4);
  piVar3 = (int *)((long)arg + 0x10);
  for (lVar2 = 0; lVar2 <= iVar1; lVar2 = lVar2 + 1) {
    *piVar3 = *piVar3 + dtime;
    piVar3 = piVar3 + 4;
  }
  return 0;
}

Assistant:

static status_t
dtime_clb(time_t dtime, void *_args)
{
	struct file_play_args *args = _args;
	status_t ret = args->delay_clb(
		dtime,
		map_get(&args->file->ctrl[FCTRL_TEMPO], args->time, NULL),
		args->arg
	);
	args->time += dtime;
	return ret;
}